

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O3

int imagetotif(opj_image_t *image,char *outfile)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  opj_image_comp_t *poVar3;
  convert_32s_PXCX p_Var4;
  opj_image_comp_t *poVar5;
  long lVar6;
  OPJ_SIZE_T OVar7;
  OPJ_BYTE *pOVar8;
  OPJ_INT32 *__ptr;
  code *pcVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  OPJ_INT32 OVar13;
  undefined4 uVar14;
  OPJ_SIZE_T OVar15;
  uint uVar16;
  long lVar17;
  OPJ_INT32 *planes [4];
  ulong local_88;
  OPJ_INT32 *local_58;
  long local_50 [4];
  
  poVar3 = image->comps;
  uVar16 = poVar3->prec;
  local_58 = poVar3->data;
  uVar11 = image->numcomps;
  if (image->color_space == OPJ_CLRSPC_CMYK) {
    if (uVar11 < 4) {
      imagetotif_cold_4();
      return 1;
    }
    uVar14 = 5;
    uVar12 = 4;
  }
  else if (uVar11 < 3) {
    uVar14 = 1;
    uVar12 = 2;
    uVar10 = 1;
    if (uVar11 != 2) {
LAB_0010d133:
      if ((uint)uVar10 != uVar11) {
        imagetotif_cold_1();
        return 1;
      }
      goto LAB_0010d13c;
    }
  }
  else {
    uVar12 = 4;
    if (uVar11 < 4) {
      uVar12 = (ulong)uVar11;
    }
    uVar14 = 2;
  }
  uVar11 = (uint)uVar12;
  OVar1 = poVar3->dx;
  uVar10 = 1;
  poVar5 = poVar3;
  do {
    if ((((OVar1 != poVar5[1].dx) || (poVar3->dy != poVar5[1].dy)) || (uVar16 != poVar5[1].prec)) ||
       (poVar3->sgnd != poVar5[1].sgnd)) goto LAB_0010d133;
    local_50[uVar10 - 1] = (long)poVar5[1].data;
    uVar10 = uVar10 + 1;
    poVar5 = poVar5 + 1;
  } while (uVar12 != uVar10);
LAB_0010d13c:
  if (((int)uVar16 < 0x11) && (uVar16 != 0)) {
    lVar6 = TIFFOpen(outfile);
    if (lVar6 != 0) {
      if (uVar11 == 0) {
        local_88 = 0;
      }
      else {
        local_88 = (ulong)uVar11;
        lVar17 = 0;
        do {
          clip_component((opj_image_comp_t *)((long)&image->comps->dx + lVar17),image->comps->prec);
          lVar17 = lVar17 + 0x40;
        } while (local_88 << 6 != lVar17);
      }
      OVar13 = 0;
      switch(uVar16) {
      case 1:
      case 2:
      case 4:
      case 6:
      case 8:
        pcVar9 = convert_32sXXu_C1R_LUT[uVar16];
        break;
      case 3:
        pcVar9 = tif_32sto3u;
        break;
      case 5:
        pcVar9 = tif_32sto5u;
        break;
      case 7:
        pcVar9 = tif_32sto7u;
        break;
      case 9:
        pcVar9 = tif_32sto9u;
        break;
      case 10:
        pcVar9 = tif_32sto10u;
        break;
      case 0xb:
        pcVar9 = tif_32sto11u;
        break;
      case 0xc:
        pcVar9 = tif_32sto12u;
        break;
      case 0xd:
        pcVar9 = tif_32sto13u;
        break;
      case 0xe:
        pcVar9 = tif_32sto14u;
        break;
      case 0xf:
        pcVar9 = tif_32sto15u;
        break;
      case 0x10:
        pcVar9 = tif_32sto16u;
        break;
      default:
        pcVar9 = (convert_32sXXx_C1R)0x0;
      }
      poVar3 = image->comps;
      if (poVar3->sgnd != 0) {
        OVar13 = 1 << ((char)poVar3->prec - 1U & 0x1f);
      }
      p_Var4 = convert_32s_PXCX_LUT[local_88];
      OVar1 = poVar3->w;
      OVar2 = poVar3->h;
      TIFFSetField(lVar6,0x100);
      TIFFSetField(lVar6,0x101,OVar2);
      TIFFSetField(lVar6,0x115,uVar11);
      TIFFSetField(lVar6,0x102,uVar16);
      TIFFSetField(lVar6,0x112,1);
      TIFFSetField(lVar6,0x11c,1);
      TIFFSetField(lVar6,0x106,uVar14);
      TIFFSetField(lVar6,0x116,1);
      uVar12 = TIFFStripSize(lVar6);
      OVar7 = (OPJ_SIZE_T)(int)OVar1;
      OVar15 = local_88 * OVar7;
      if ((long)(int)uVar16 * OVar15 + 7 >> 3 != uVar12) {
        imagetotif_cold_2();
        return 1;
      }
      pOVar8 = (OPJ_BYTE *)_TIFFmalloc(uVar12);
      if (pOVar8 != (OPJ_BYTE *)0x0) {
        __ptr = (OPJ_INT32 *)malloc(OVar15 * 4);
        if (__ptr != (OPJ_INT32 *)0x0) {
          if (image->comps->h != 0) {
            uVar16 = 0;
            lVar17 = OVar7 * 4;
            do {
              (*p_Var4)(&local_58,__ptr,OVar7,OVar13);
              (*pcVar9)(__ptr,pOVar8,OVar15);
              TIFFWriteEncodedStrip(lVar6,uVar16,pOVar8,uVar12);
              local_58 = local_58 + OVar7;
              local_50[0] = local_50[0] + lVar17;
              local_50[1] = local_50[1] + lVar17;
              local_50[2] = local_50[2] + lVar17;
              uVar16 = uVar16 + 1;
            } while (uVar16 < image->comps->h);
          }
          _TIFFfree(pOVar8);
          TIFFClose(lVar6);
          free(__ptr);
          return 0;
        }
        _TIFFfree(pOVar8);
      }
      TIFFClose(lVar6);
      return 1;
    }
    fprintf(_stderr,"imagetotif:failed to open %s for writing\n",outfile);
  }
  else {
    imagetotif_cold_3();
  }
  return 1;
}

Assistant:

int imagetotif(opj_image_t * image, const char *outfile)
{
	int width, height;
	int bps,adjust, sgnd;
	int tiPhoto;
	TIFF *tif;
	tdata_t buf;
	tsize_t strip_size;
	OPJ_UINT32 i, numcomps;
	OPJ_SIZE_T rowStride;
	OPJ_INT32* buffer32s = NULL;
	OPJ_INT32 const* planes[4];
	convert_32s_PXCX cvtPxToCx = NULL;
	convert_32sXXx_C1R cvt32sToTif = NULL;

	bps = (int)image->comps[0].prec;
	planes[0] = image->comps[0].data;
	
	numcomps = image->numcomps;
	
	if (image->color_space == OPJ_CLRSPC_CMYK) {
		if (numcomps < 4U) {
			fprintf(stderr,"imagetotif: CMYK images shall be composed of at least 4 planes.\n");
			fprintf(stderr,"\tAborting\n");
			return 1;
		}
		tiPhoto = PHOTOMETRIC_SEPARATED;
		if (numcomps > 4U) {
			numcomps = 4U; /* Alpha not supported */
		}
	}
	else if (numcomps > 2U) {
		tiPhoto = PHOTOMETRIC_RGB;
		if (numcomps > 4U) {
			numcomps = 4U;
		}
	} else {
		tiPhoto = PHOTOMETRIC_MINISBLACK;
	}
	for (i = 1U; i < numcomps; ++i) {
		if (image->comps[0].dx != image->comps[i].dx) {
			break;
		}
		if (image->comps[0].dy != image->comps[i].dy) {
			break;
		}
		if (image->comps[0].prec != image->comps[i].prec) {
			break;
		}
		if (image->comps[0].sgnd != image->comps[i].sgnd) {
			break;
		}
		planes[i] = image->comps[i].data;
	}
	if (i != numcomps) {
		fprintf(stderr,"imagetotif: All components shall have the same subsampling, same bit depth.\n");
		fprintf(stderr,"\tAborting\n");
		return 1;
	}
	
	if(bps > 16) bps = 0;
	if(bps == 0)
	{
		fprintf(stderr,"imagetotif: Bits=%d, Only 1 to 16 bits implemented\n",bps);
		fprintf(stderr,"\tAborting\n");
		return 1;
	}
	tif = TIFFOpen(outfile, "wb");
	if (!tif)
	{
		fprintf(stderr, "imagetotif:failed to open %s for writing\n", outfile);
		return 1;
	}
	for (i = 0U; i < numcomps; ++i) {
		clip_component(&(image->comps[i]), image->comps[0].prec);
	}
	cvtPxToCx = convert_32s_PXCX_LUT[numcomps];
	switch (bps) {
		case 1:
		case 2:
		case 4:
		case 6:
		case 8:
			cvt32sToTif = convert_32sXXu_C1R_LUT[bps];
			break;
		case 3:
			cvt32sToTif = tif_32sto3u;
			break;
		case 5:
			cvt32sToTif = tif_32sto5u;
			break;
		case 7:
			cvt32sToTif = tif_32sto7u;
			break;
		case 9:
			cvt32sToTif = tif_32sto9u;
			break;
		case 10:
			cvt32sToTif = tif_32sto10u;
			break;
		case 11:
			cvt32sToTif = tif_32sto11u;
			break;
		case 12:
			cvt32sToTif = tif_32sto12u;
			break;
		case 13:
			cvt32sToTif = tif_32sto13u;
			break;
		case 14:
			cvt32sToTif = tif_32sto14u;
			break;
		case 15:
			cvt32sToTif = tif_32sto15u;
			break;
		case 16:
			cvt32sToTif = (convert_32sXXx_C1R)tif_32sto16u;
			break;
		default:
			/* never here */
			break;
	}
	sgnd = (int)image->comps[0].sgnd;
	adjust = sgnd ? 1 << (image->comps[0].prec - 1) : 0;
	width   = (int)image->comps[0].w;
	height  = (int)image->comps[0].h;
	
	TIFFSetField(tif, TIFFTAG_IMAGEWIDTH, width);
	TIFFSetField(tif, TIFFTAG_IMAGELENGTH, height);
	TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, numcomps);
	TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, bps);
	TIFFSetField(tif, TIFFTAG_ORIENTATION, ORIENTATION_TOPLEFT);
	TIFFSetField(tif, TIFFTAG_PLANARCONFIG, PLANARCONFIG_CONTIG);
	TIFFSetField(tif, TIFFTAG_PHOTOMETRIC, tiPhoto);
	TIFFSetField(tif, TIFFTAG_ROWSPERSTRIP, 1);
	
	strip_size = TIFFStripSize(tif);
	rowStride = ((OPJ_SIZE_T)width * numcomps * (OPJ_SIZE_T)bps + 7U) / 8U;
	if (rowStride != (OPJ_SIZE_T)strip_size) {
		fprintf(stderr, "Invalid TIFF strip size\n");
		TIFFClose(tif);
		return 1;
	}
	buf = _TIFFmalloc(strip_size);
	if (buf == NULL) {
		TIFFClose(tif);
		return 1;
	}
	buffer32s = (OPJ_INT32 *)malloc((OPJ_SIZE_T)width * numcomps * sizeof(OPJ_INT32));
	if (buffer32s == NULL) {
		_TIFFfree(buf);
		TIFFClose(tif);
		return 1;
	}
	
	for (i = 0; i < image->comps[0].h; ++i) {
		cvtPxToCx(planes, buffer32s, (OPJ_SIZE_T)width, adjust);
		cvt32sToTif(buffer32s, (OPJ_BYTE *)buf, (OPJ_SIZE_T)width * numcomps);
		(void)TIFFWriteEncodedStrip(tif, i, (void*)buf, strip_size);
		planes[0] += width;
		planes[1] += width;
		planes[2] += width;
		planes[3] += width;
	}
	_TIFFfree((void*)buf);
	TIFFClose(tif);
	free(buffer32s);
		
	return 0;
}